

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O2

HomomorphismResult *
gss::solve_homomorphism_problem
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<gss::innards::Proof> *psVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  ThreadedSolver *pTVar5;
  element_type *this;
  pointer __last;
  pointer __last_00;
  HomomorphismModel *pHVar6;
  HomomorphismParams *pHVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  SearchResult SVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  mapped_type *pmVar19;
  size_type __n;
  pointer __result;
  thread *ptVar20;
  _Rb_tree_node_base *p_Var21;
  UnsupportedConfiguration *pUVar22;
  anon_class_16_2_f4d75bda_for__M_head_impl *extraout_RDX;
  anon_class_16_2_f4d75bda_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_f4d75bda_for__M_head_impl *__args;
  anon_class_16_2_f4d75bda_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_f4d75bda_for__M_head_impl *__args_00;
  thread *th;
  pointer ptVar23;
  int iVar24;
  uint uVar25;
  _List_node_base *p_Var26;
  _List_node_base *p_Var27;
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
  *pWVar28;
  int q;
  shared_ptr<gss::innards::Proof> proof;
  atomic<bool> restart_synchroniser;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  HomomorphismAssignments assignments_copy;
  code *pcStack_16e0;
  undefined1 auStack_16c8 [16];
  string nogoods_lengths_str;
  SequentialSolver solver;
  vector<int,_std::allocator<int>_> cancel_out;
  _Rb_tree_node_base *local_1650;
  undefined1 local_1640 [16];
  unsigned_long_long local_1630;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1628;
  data_type local_1608;
  uint local_15f8;
  undefined2 local_15f4;
  bool local_15f2;
  bool local_15e8;
  HomomorphismAssignments assignments;
  bool done;
  ThreadedSolver solver_1;
  Domains domains;
  string by_thread_propagations;
  string by_thread_nodes;
  HomomorphismModel model;
  mutex duplicate_filter_set_mutex;
  vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
  searchers;
  Domains common_domains;
  vector<int,_std::allocator<int>_> permitted;
  undefined1 local_1438 [16];
  _Any_data local_1428 [2];
  _Storage<gss::ProofOptions,_false> _Stack_1408;
  bool local_13c0;
  element_type *local_13b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_13b0;
  bool local_13a8;
  bool local_13a0;
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
  local_a0;
  
  proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((params->proof_options).super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
      super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
      super__Optional_payload_base<gss::ProofOptions>._M_engaged == true) {
    if (params->n_threads != 1) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,"Proof logging cannot yet be used with threads",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (params->clique_detection == true) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,
                 "Proof logging cannot yet be used with clique detection, use --no-clique-detection"
                 ,(allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->lackey)._M_t.
        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t
        .super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
        super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl != (Lackey *)0x0) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,"Proof logging cannot yet be used with a lackey",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (((params->pattern_less_constraints).
         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&params->pattern_less_constraints) ||
       ((params->target_occur_less_constraints).
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next !=
        (_List_node_base *)&params->target_occur_less_constraints)) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,"Proof logging cannot yet be used with less-constraints",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->injectivity & ~NonInjective) != Injective) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,
                 "Proof logging can currently only be used with injectivity or non-injectivity",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar11 = InputGraph::has_vertex_labels(pattern);
    if ((bVar11) || (bVar11 = InputGraph::has_edge_labels(pattern), bVar11)) {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,"Proof logging cannot yet be used on labelled graphs",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    std::make_shared<gss::innards::Proof,gss::ProofOptions_const&>((ProofOptions *)&permitted);
    std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)&permitted);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    for (iVar24 = 0; iVar12 = InputGraph::size(pattern),
        this = proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        iVar24 < iVar12; iVar24 = iVar24 + 1) {
      iVar12 = InputGraph::size(target);
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:438:17)>
                    ::_M_manager;
      local_1650 = (_Rb_tree_node_base *)
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
                   ::_M_invoke;
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
                    ::_M_manager;
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)target;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pattern;
      innards::Proof::create_cp_variable
                (this,iVar24,iVar12,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&permitted,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)&cancel_out);
      std::_Function_base::~_Function_base((_Function_base *)&cancel_out);
      std::_Function_base::~_Function_base((_Function_base *)&permitted);
    }
    if (params->injectivity == Injective) {
      iVar24 = InputGraph::size(pattern);
      iVar12 = InputGraph::size(target);
      innards::Proof::create_injectivity_constraints(this,iVar24,iVar12);
    }
    for (iVar24 = 0; iVar12 = InputGraph::size(pattern), iVar24 < iVar12; iVar24 = iVar24 + 1) {
      iVar12 = 0;
      while (model._imp._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl.
             _0_4_ = iVar12, iVar13 = InputGraph::size(target), iVar12 < iVar13) {
        innards::Proof::start_adjacency_constraints_for
                  (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   iVar24,(int)model._imp._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                               ._M_head_impl);
        for (iVar12 = 0; iVar13 = InputGraph::size(pattern), iVar12 < iVar13; iVar12 = iVar12 + 1) {
          bVar11 = InputGraph::adjacent(pattern,iVar24,iVar12);
          if (bVar11) {
            permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)0x0;
            iVar13 = 0;
            permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)0x0;
            cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)0x0;
            while( true ) {
              assignments_copy.values.
              super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(assignments_copy.values.
                                     super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar13);
              iVar14 = InputGraph::size(target);
              if (iVar14 <= iVar13) break;
              bVar11 = InputGraph::adjacent
                                 (target,(int)model._imp._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl,
                                  (int)assignments_copy.values.
                                       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              if (bVar11) {
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           &permitted.super__Vector_base<int,_std::allocator<int>_>,
                           (value_type_conflict1 *)&assignments_copy);
                if ((int)model._imp._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                         _M_head_impl ==
                    (int)assignments_copy.values.
                         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                         ._M_impl.super__Vector_impl_data._M_start) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             &cancel_out.super__Vector_base<int,_std::allocator<int>_>,
                             (value_type_conflict1 *)&model);
                }
              }
              iVar13 = (int)assignments_copy.values.
                            super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1;
            }
            innards::Proof::create_adjacency_constraint
                      (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,iVar24,iVar12,
                       (int)model._imp._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl,
                       (vector<int,_std::allocator<int>_> *)
                       &permitted.super__Vector_base<int,_std::allocator<int>_>,
                       (vector<int,_std::allocator<int>_> *)
                       &cancel_out.super__Vector_base<int,_std::allocator<int>_>,false);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&cancel_out.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&permitted.super__Vector_base<int,_std::allocator<int>_>);
          }
        }
        if (params->induced == true) {
          for (iVar12 = 0; iVar13 = InputGraph::size(pattern), iVar12 < iVar13; iVar12 = iVar12 + 1)
          {
            if ((iVar12 != iVar24) &&
               (bVar11 = InputGraph::adjacent(pattern,iVar24,iVar12), !bVar11)) {
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              iVar13 = 0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              while( true ) {
                cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(cancel_out.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar13);
                iVar14 = InputGraph::size(target);
                if (iVar14 <= iVar13) break;
                if (((int)model._imp._M_t.
                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl !=
                     (int)cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) &&
                   (bVar11 = InputGraph::adjacent
                                       (target,(int)model._imp._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl,
                                        (int)cancel_out.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start), !bVar11)) {
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)
                             &permitted.super__Vector_base<int,_std::allocator<int>_>,
                             (value_type_conflict1 *)
                             &cancel_out.super__Vector_base<int,_std::allocator<int>_>);
                }
                iVar13 = (int)cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 1;
              }
              cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              innards::Proof::create_adjacency_constraint
                        (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,iVar24,iVar12,
                         (int)model._imp._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                              _M_head_impl,
                         (vector<int,_std::allocator<int>_> *)
                         &permitted.super__Vector_base<int,_std::allocator<int>_>,
                         (vector<int,_std::allocator<int>_> *)
                         &cancel_out.super__Vector_base<int,_std::allocator<int>_>,true);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&cancel_out.super__Vector_base<int,_std::allocator<int>_>);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&permitted.super__Vector_base<int,_std::allocator<int>_>);
            }
          }
        }
        iVar12 = (int)model._imp._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl + 1;
      }
    }
    innards::Proof::finalise_model
              (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  bVar11 = innards::is_nonshrinking(params);
  if (bVar11) {
    iVar24 = InputGraph::size(pattern);
    iVar12 = InputGraph::size(target);
    if (iVar12 < iVar24) {
      if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        innards::Proof::failure_due_to_pattern_bigger_than_target
                  (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        innards::Proof::finish_unsat_proof
                  (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->mapping)._M_t._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header
           = 0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           ZEXT416(0) << 0x40;
      __return_storage_ptr__->propagations = 0;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      __return_storage_ptr__->complete = false;
      goto LAB_0011e3ab;
    }
  }
  if (((((params->injectivity == NonInjective) &&
        (bVar11 = InputGraph::has_vertex_labels(pattern), !bVar11)) &&
       (bVar11 = InputGraph::has_edge_labels(pattern), !bVar11)) &&
      ((bVar11 = InputGraph::loopy(target), bVar11 && (params->count_solutions == false)))) &&
     ((params->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)) {
    HomomorphismResult::HomomorphismResult(__return_storage_ptr__);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[27]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->extra_stats,(char (*) [27])"used_loops_property = true");
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,0xffffffff);
    __return_storage_ptr__->complete = true;
    for (iVar24 = 0; iVar12 = InputGraph::size(target), iVar24 < iVar12; iVar24 = iVar24 + 1) {
      bVar11 = InputGraph::adjacent(target,iVar24,iVar24);
      if (bVar11) {
        permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,iVar24);
        break;
      }
    }
    iVar24 = 0;
    while( true ) {
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar24);
      iVar12 = InputGraph::size(pattern);
      if (iVar12 <= iVar24) break;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int&,int&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,(int *)&cancel_out,(int *)&permitted);
      iVar24 = (int)cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    }
    boost::multiprecision::backends::
    eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              (&(__return_storage_ptr__->solution_count).m_backend);
    goto LAB_0011e3ab;
  }
  bVar11 = innards::can_use_clique(params);
  if ((bVar11) && (bVar11 = innards::is_simple_clique(pattern), bVar11)) {
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1438._0_8_ = 0x1ffffffff;
    local_1438._8_8_ = local_1438._8_8_ & 0xffffffffffffff00;
    local_1428[0]._M_unused._M_object = (void *)0x0;
    local_1428[0]._8_8_ = (vector<int,_std::allocator<int>_> *)0x0;
    local_1428[1]._0_4_ = 0;
    local_1428[1]._4_4_ = 0;
    local_1428[1]._8_8_ = (string *)0x0;
    local_13c0 = false;
    local_13a0 = false;
    local_13b8 = (element_type *)0x0;
    _Stack_13b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_13a8 = false;
    std::__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)&permitted,
               (__shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2> *)params);
    permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)(params->start_time).__d.__r;
    InputGraph::size(pattern);
    std::make_unique<gss::NoRestartsSchedule>();
    cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
    ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                 *)&cancel_out);
    solve_clique_problem((CliqueResult *)&cancel_out,target,(CliqueParams *)&permitted);
    HomomorphismResult::HomomorphismResult(__return_storage_ptr__);
    iVar24 = 0;
    for (; local_1650 !=
           (_Rb_tree_node_base *)
           &cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish; local_1650 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1650)) {
      model._imp._M_t.
      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl._0_4_ =
           iVar24;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int,int_const&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,(int *)&model,(int *)(local_1650 + 1));
      iVar12 = InputGraph::size(pattern);
      iVar24 = iVar24 + 1;
      if (iVar12 <= iVar24) break;
    }
    __return_storage_ptr__->nodes = local_1640._8_8_;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&__return_storage_ptr__->extra_stats);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[26]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->extra_stats,(char (*) [26])"used_clique_solver = true");
    __return_storage_ptr__->complete = (bool)local_1608.ld.capacity._0_1_;
    CliqueResult::~CliqueResult((CliqueResult *)&cancel_out);
    CliqueParams::~CliqueParams((CliqueParams *)&permitted);
    goto LAB_0011e3ab;
  }
  innards::HomomorphismModel::HomomorphismModel(&model,target,pattern,params,&proof);
  bVar11 = innards::HomomorphismModel::prepare(&model);
  HomomorphismResult::HomomorphismResult(__return_storage_ptr__);
  if (bVar11) {
    if (params->n_threads == 1) {
      psVar2 = &solver.super_HomomorphismSolver.proof;
      solver.super_HomomorphismSolver.model = &model;
      solver.super_HomomorphismSolver.params = params;
      std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&psVar2->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
                 &proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
      local_1628.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1628;
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffff00000000);
      cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1640 = ZEXT816(0);
      local_1630 = 0;
      local_1628.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      local_1608.la[0] = 0;
      local_15f8 = 1;
      local_15f4._0_1_ = false;
      local_15f4._1_1_ = true;
      local_15f2 = false;
      local_15e8 = false;
      uVar25 = (solver.super_HomomorphismSolver.model)->pattern_size;
      local_1628.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           local_1628.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      innards::HomomorphismDomain::HomomorphismDomain
                ((HomomorphismDomain *)&permitted,
                 (solver.super_HomomorphismSolver.model)->target_size);
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      vector(&domains,(ulong)uVar25,(value_type *)&permitted,(allocator_type *)&assignments_copy);
      innards::SVOBitset::~SVOBitset
                ((SVOBitset *)
                 &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      bVar11 = innards::HomomorphismModel::initialise_domains
                         (solver.super_HomomorphismSolver.model,&domains);
      if (bVar11) {
        assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::reserve(&assignments.values,(ulong)(solver.super_HomomorphismSolver.model)->pattern_size);
        lVar17 = std::chrono::_V2::steady_clock::now();
        done = false;
        assignments_copy.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        assignments_copy.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pcStack_16e0 = std::
                       _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
                       ::_M_invoke;
        assignments_copy.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
                      ::_M_manager;
        innards::HomomorphismSearcher::HomomorphismSearcher
                  ((HomomorphismSearcher *)&permitted,solver.super_HomomorphismSolver.model,
                   solver.super_HomomorphismSolver.params,
                   (DuplicateSolutionFilterer *)&assignments_copy,psVar2);
        std::_Function_base::~_Function_base((_Function_base *)&assignments_copy);
        uVar25 = 0;
        while (done == false) {
          uVar25 = uVar25 + 1;
          assignments_copy.values.
          super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)&done;
          p_Var26 = (_List_node_base *)&local_a0.need_to_watch;
          assignments_copy.values.
          super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&domains;
          while (p_Var26 = (((_List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                              *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var27 = (_List_node_base *)&local_a0.gathered_need_to_watch,
                p_Var26 != (_List_node_base *)&local_a0.need_to_watch) {
            bVar11 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var26 + 1),
                                (anon_class_16_2_c26f802a *)&assignments_copy);
            if (bVar11) goto LAB_0011deae;
          }
          while (p_Var27 = (((_List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                              *)&p_Var27->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var27 != (_List_node_base *)&local_a0.gathered_need_to_watch) {
            bVar11 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var27 + 1),
                                (anon_class_16_2_c26f802a *)&assignments_copy);
            if (bVar11) goto LAB_0011deae;
          }
          done = false;
          innards::
          Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
          ::clear_new_nogoods(&local_a0);
          local_1630 = local_1630 + 1;
          bVar11 = innards::HomomorphismSearcher::propagate
                             ((HomomorphismSearcher *)&permitted,true,&domains,&assignments,
                              (solver.super_HomomorphismSolver.params)->propagate_using_lackey !=
                              Never);
          if (bVar11) {
            std::
            vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ::vector((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)&assignments_copy,&assignments.values);
            SVar15 = innards::HomomorphismSearcher::restarting_search
                               ((HomomorphismSearcher *)&permitted,&assignments_copy,&domains,
                                (unsigned_long_long *)(local_1640 + 8),&local_1630,
                                (loooong *)&local_1608.ld,0,
                                ((solver.super_HomomorphismSolver.params)->restarts_schedule)._M_t.
                                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)
            ;
            switch(SVar15) {
            case Aborted:
              done = true;
              break;
            case Satisfiable:
              innards::HomomorphismSearcher::save_result
                        ((HomomorphismSearcher *)&permitted,&assignments_copy,
                         (HomomorphismResult *)&cancel_out);
            case Unsatisfiable:
            case UnsatisfiableAndBackjumpUsingLackey:
            case SatisfiableButKeepGoing:
              local_15e8 = true;
              done = true;
            }
            std::
            _Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ::~_Vector_base((_Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                             *)&assignments_copy);
          }
          else {
            if (solver.super_HomomorphismSolver.proof.
                super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              innards::Proof::root_propagation_failed
                        (solver.super_HomomorphismSolver.proof.
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
            }
            local_15e8 = true;
            done = true;
          }
          (*(((solver.super_HomomorphismSolver.params)->restarts_schedule)._M_t.
             super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
             .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
            _vptr_RestartsSchedule[3])();
        }
        goto LAB_0011debe;
      }
      local_15e8 = true;
      innards::HomomorphismModel::add_extra_stats(solver.super_HomomorphismSolver.model,&local_1628)
      ;
      goto LAB_0011e326;
    }
    iVar24 = (*((params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    if ((char)iVar24 == '\0') {
      pUVar22 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&permitted,"Threaded search requires restarts",
                 (allocator<char> *)&cancel_out);
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar22,(string *)&permitted);
      __cxa_throw(pUVar22,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    uVar16 = innards::how_many_threads(params->n_threads);
    psVar2 = &solver_1.super_HomomorphismSolver.proof;
    solver_1.super_HomomorphismSolver.model = &model;
    solver_1.super_HomomorphismSolver.params = params;
    std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&psVar2->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
               &proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
    local_1628.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1628;
    by_thread_nodes._M_dataplus._M_p = (pointer)&by_thread_nodes.field_2;
    by_thread_propagations._M_dataplus._M_p = (pointer)&by_thread_propagations.field_2;
    nogoods_lengths_str._M_dataplus._M_p = (pointer)0x0;
    nogoods_lengths_str._M_string_length = 0;
    nogoods_lengths_str.field_2._M_allocated_capacity = 0;
    nogoods_lengths_str.field_2._8_8_ = 0;
    local_1640 = ZEXT416(0) << 0x40;
    cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((ulong)cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish & 0xffffffff00000000);
    cancel_out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1630 = 0;
    by_thread_nodes._M_string_length = 0;
    by_thread_propagations._M_string_length = 0;
    by_thread_nodes.field_2._M_local_buf[0] = '\0';
    by_thread_propagations.field_2._M_local_buf[0] = '\0';
    local_1628.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    local_1608.la[0] = 0;
    local_15f8 = 1;
    local_15f4._0_1_ = false;
    local_15f4._1_1_ = true;
    local_15f2 = false;
    local_15e8 = false;
    uVar25 = (solver_1.super_HomomorphismSolver.model)->pattern_size;
    local_1628.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_1628.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    solver_1.n_threads = uVar16;
    innards::HomomorphismDomain::HomomorphismDomain
              ((HomomorphismDomain *)&permitted,
               (solver_1.super_HomomorphismSolver.model)->target_size);
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::vector(&common_domains,(ulong)uVar25,(value_type *)&permitted,
             (allocator_type *)&assignments_copy);
    innards::SVOBitset::~SVOBitset
              ((SVOBitset *)
               &permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    bVar11 = innards::HomomorphismModel::initialise_domains
                       (solver_1.super_HomomorphismSolver.model,&common_domains);
    if (bVar11) {
      lVar17 = std::chrono::_V2::steady_clock::now();
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<std::thread,_std::allocator<std::thread>_>::reserve
                (&threads,(ulong)solver_1.n_threads);
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::vector(&searchers,(ulong)solver_1.n_threads,(allocator_type *)&permitted);
      std::__tree_barrier<std::__empty_completion>::__tree_barrier
                ((__tree_barrier<std::__empty_completion> *)&solver,solver_1.n_threads);
      std::__tree_barrier<std::__empty_completion>::__tree_barrier
                ((__tree_barrier<std::__empty_completion> *)&domains,solver_1.n_threads);
      pHVar7 = solver_1.super_HomomorphismSolver.params;
      pHVar6 = solver_1.super_HomomorphismSolver.model;
      assignments_copy.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_16c8;
      duplicate_filter_set_mutex.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      duplicate_filter_set_mutex.super___mutex_base._M_mutex.__align = 0;
      duplicate_filter_set_mutex.super___mutex_base._M_mutex._8_8_ = 0;
      duplicate_filter_set_mutex.super___mutex_base._M_mutex._16_8_ = 0;
      duplicate_filter_set_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      register0x00001200 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )(ZEXT416(0) << 0x40);
      assignments_copy.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&uRam0000000000000000 + 1);
      restart_synchroniser._M_base._M_i = (__atomic_base<bool>)false;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&searchers;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&common_domains;
      permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&threads;
      std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> *)local_1438,
                 &psVar2->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
      local_1428[0]._8_8_ = &cancel_out;
      local_1428[1]._0_8_ = &nogoods_lengths_str;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1428[0]._0_4_ = solver_1.n_threads;
      local_1428[1]._8_8_ = &by_thread_nodes;
      _Stack_1408._M_value.opb_file._M_dataplus._M_p = (_Alloc_hider)&by_thread_propagations;
      _Stack_1408._M_value.opb_file._M_string_length = (size_type)&solver;
      _Stack_1408._16_8_ = &domains;
      _Stack_1408._M_value.log_file._M_dataplus._M_p = (_Alloc_hider)&assignments_copy;
      _Stack_1408._24_8_ = &restart_synchroniser;
      _Stack_1408._M_value.log_file._M_string_length = (size_type)&duplicate_filter_set_mutex;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x90);
      uVar10 = local_1438._8_8_;
      uVar8 = local_1438._0_8_;
      local_1438._8_8_ = 0;
      local_1438._0_8_ = 0;
      uVar9 = local_1438._0_8_;
      *(pointer *)
       &(assignments.values.
         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ._M_impl.super__Vector_impl_data._M_start)->choice_count =
           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(HomomorphismAssignments **)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[1].assignment.target_vertex = &assignments;
      *(HomomorphismModel **)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[1].discrepancy_count = pHVar6;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[2].assignment = (HomomorphismAssignment)pHVar7;
      (assignments.values.
       super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
       ._M_impl.super__Vector_impl_data._M_start)->assignment =
           (HomomorphismAssignment)
           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(pointer *)
       &(assignments.values.
         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ._M_impl.super__Vector_impl_data._M_start)->is_decision =
           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)
       &(assignments.values.
         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ._M_impl.super__Vector_impl_data._M_start)->choice_count =
           permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      *(HomomorphismAssignments **)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[1].assignment.target_vertex = &assignments;
      local_1438[0] = (undefined1)uVar8;
      local_1438._1_3_ = SUB83(uVar8,1);
      local_1438._4_4_ = SUB84(uVar8,4);
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[2].is_decision = (bool)local_1438[0];
      *(undefined3 *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[2].field_0x9 = local_1438._1_3_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[2].discrepancy_count = local_1438._4_4_;
      *(undefined8 *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[2].choice_count = uVar10;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
                    ::_M_manager;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].assignment.pattern_vertex = local_1428[1]._0_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].assignment.target_vertex = local_1428[1]._4_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].is_decision = (bool)local_1428[1]._8_1_;
      *(undefined3 *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[4].field_0x9 = local_1428[1]._9_3_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].discrepancy_count = local_1428[1]._12_4_;
      *(_Alloc_hider *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[4].choice_count =
           _Stack_1408._M_value.opb_file._M_dataplus._M_p;
      *(size_type *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[5].assignment.target_vertex =
           _Stack_1408._M_value.opb_file._M_string_length;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[5].discrepancy_count = _Stack_1408._16_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[5].choice_count = _Stack_1408._20_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[6].assignment.pattern_vertex = _Stack_1408._24_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[6].assignment.target_vertex = _Stack_1408._28_4_;
      *(_Alloc_hider *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[6].is_decision =
           _Stack_1408._M_value.log_file._M_dataplus._M_p;
      *(size_type *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[6].choice_count =
           _Stack_1408._M_value.log_file._M_string_length;
      *(undefined8 *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[3].assignment.target_vertex =
           local_1428[0]._M_unused._M_object;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[3].discrepancy_count = local_1428[0]._8_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[3].choice_count = local_1428[0]._12_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].assignment.pattern_vertex = local_1428[1]._0_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].assignment.target_vertex = local_1428[1]._4_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].is_decision = (bool)local_1428[1]._8_1_;
      *(undefined3 *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[4].field_0x9 = local_1428[1]._9_3_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[4].discrepancy_count = local_1428[1]._12_4_;
      *(_Alloc_hider *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[4].choice_count =
           _Stack_1408._M_value.opb_file._M_dataplus._M_p;
      *(size_type *)
       &assignments.values.
        super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ._M_impl.super__Vector_impl_data._M_start[5].assignment.target_vertex =
           _Stack_1408._M_value.opb_file._M_string_length;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[5].discrepancy_count = _Stack_1408._16_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[5].choice_count = _Stack_1408._20_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[6].assignment.pattern_vertex = _Stack_1408._24_4_;
      assignments.values.
      super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ._M_impl.super__Vector_impl_data._M_start[6].assignment.target_vertex = _Stack_1408._28_4_;
      local_1438._0_8_ = uVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1438 + 8));
      if ((solver_1.super_HomomorphismSolver.params)->delay_thread_creation == false) {
        __args_00 = extraout_RDX;
        for (uVar25 = 0;
            __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            ptVar23 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar25 < solver_1.n_threads;
            uVar25 = uVar25 + 1) {
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(permitted.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,uVar25);
          permitted.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)&assignments;
          if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                            (&threads,1,"vector::_M_realloc_insert");
            __last_00 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            ptVar23 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_start;
            __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                 (&threads.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>,__n
                                 );
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                      ((allocator_type *)(((long)__last - (long)ptVar23) + (long)__result),
                       (thread *)&permitted,__args);
            ptVar20 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                (ptVar23,__last,__result,(allocator<std::thread> *)&threads);
            ptVar20 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                (__last,__last_00,ptVar20 + 1,(allocator<std::thread> *)&threads);
            std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                      ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar23,
                       (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar23 >> 3)
            ;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = __result + __n;
            __args_00 = extraout_RDX_01;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = __result;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = ptVar20;
          }
          else {
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                      ((allocator_type *)
                       threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish,(thread *)&permitted,__args_00);
            __args_00 = extraout_RDX_00;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        for (; ptVar23 != __last; ptVar23 = ptVar23 + 1) {
          std::thread::join();
        }
      }
      else {
        std::function<void_(unsigned_int)>::operator()
                  ((function<void_(unsigned_int)> *)&assignments,0);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted
                     ,"by_thread_nodes =",&by_thread_nodes);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted);
      std::__cxx11::string::~string((string *)&permitted);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted
                     ,"by_thread_propagations =",&by_thread_propagations);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted);
      std::__cxx11::string::~string((string *)&permitted);
      lVar18 = std::chrono::_V2::steady_clock::now();
      std::__cxx11::to_string((string *)&done,(lVar18 - lVar17) / 1000000);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted
                     ,"search_time = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&done);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&permitted);
      std::__cxx11::string::~string((string *)&permitted);
      std::__cxx11::string::~string((string *)&done);
      std::_Function_base::~_Function_base((_Function_base *)&assignments);
      std::
      unordered_set<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
      ::~unordered_set((unordered_set<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                        *)&assignments_copy);
      std::
      unique_ptr<std::__tree_barrier<std::__empty_completion>::__state_t[],_std::default_delete<std::__tree_barrier<std::__empty_completion>::__state_t[]>_>
      ::~unique_ptr((unique_ptr<std::__tree_barrier<std::__empty_completion>::__state_t[],_std::default_delete<std::__tree_barrier<std::__empty_completion>::__state_t[]>_>
                     *)&domains.
                        super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      std::
      unique_ptr<std::__tree_barrier<std::__empty_completion>::__state_t[],_std::default_delete<std::__tree_barrier<std::__empty_completion>::__state_t[]>_>
      ::~unique_ptr((unique_ptr<std::__tree_barrier<std::__empty_completion>::__state_t[],_std::default_delete<std::__tree_barrier<std::__empty_completion>::__state_t[]>_>
                     *)&solver.super_HomomorphismSolver.params);
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::~vector(&searchers);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    }
    else {
      local_15e8 = true;
    }
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::~vector(&common_domains);
    std::__cxx11::string::~string((string *)&by_thread_propagations);
    std::__cxx11::string::~string((string *)&by_thread_nodes);
    HomomorphismResult::operator=(__return_storage_ptr__,(HomomorphismResult *)&cancel_out);
    HomomorphismResult::~HomomorphismResult((HomomorphismResult *)&cancel_out);
    pTVar5 = &solver_1;
    goto LAB_0011e358;
  }
  std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &__return_storage_ptr__->extra_stats,(char (*) [25])"model_consistent = false");
  __return_storage_ptr__->complete = true;
  if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    innards::Proof::finish_unsat_proof
              (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_0011e399:
  innards::HomomorphismModel::~HomomorphismModel(&model);
LAB_0011e3ab:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return __return_storage_ptr__;
LAB_0011deae:
  done = true;
  local_15e8 = true;
LAB_0011debe:
  iVar24 = (*(((solver.super_HomomorphismSolver.params)->restarts_schedule)._M_t.
              super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
              .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
             _vptr_RestartsSchedule[5])();
  if ((char)iVar24 != '\0') {
    std::__cxx11::to_string(&nogoods_lengths_str,uVar25);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &assignments_copy,"restarts = ",&nogoods_lengths_str);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &assignments_copy);
    std::__cxx11::string::~string((string *)&assignments_copy);
    std::__cxx11::string::~string((string *)&nogoods_lengths_str);
  }
  std::__cxx11::to_string(&nogoods_lengths_str,(solver.super_HomomorphismSolver.model)->max_graphs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &assignments_copy,"shape_graphs = ",&nogoods_lengths_str);
  std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&assignments_copy)
  ;
  std::__cxx11::string::~string((string *)&assignments_copy);
  std::__cxx11::string::~string((string *)&nogoods_lengths_str);
  lVar18 = std::chrono::_V2::steady_clock::now();
  std::__cxx11::to_string(&nogoods_lengths_str,(lVar18 - lVar17) / 1000000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &assignments_copy,"search_time = ",&nogoods_lengths_str);
  std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&assignments_copy)
  ;
  std::__cxx11::string::~string((string *)&assignments_copy);
  std::__cxx11::string::~string((string *)&nogoods_lengths_str);
  bVar11 = innards::might_have_watches(solver.super_HomomorphismSolver.params);
  if (bVar11) {
    std::__cxx11::to_string
              (&nogoods_lengths_str,
               local_a0.nogoods.
               super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
               ._M_impl._M_node._M_size);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &assignments_copy,"nogoods_size = ",&nogoods_lengths_str);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &assignments_copy);
    std::__cxx11::string::~string((string *)&assignments_copy);
    std::__cxx11::string::~string((string *)&nogoods_lengths_str);
    assignments_copy.values.
    super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)assignments_copy.values.
                          super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = &assignments_copy.values.
                    super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    stack0xffffffffffffe918 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )(auVar4 << 0x40);
    pWVar28 = &local_a0;
    while (pWVar28 = (Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
                      *)(pWVar28->nogoods).
                        super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next, pWVar28 != &local_a0) {
      nogoods_lengths_str._M_dataplus._M_p._0_4_ =
           (int)(*(long *)&pWVar28->table -
                 (pWVar28->nogoods).
                 super__List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
                 ._M_impl._M_node._M_size >> 3);
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&assignments_copy,(key_type *)&nogoods_lengths_str);
      *pmVar19 = *pmVar19 + 1;
    }
    nogoods_lengths_str._M_dataplus._M_p = (pointer)&nogoods_lengths_str.field_2;
    nogoods_lengths_str._M_string_length = 0;
    nogoods_lengths_str.field_2._M_allocated_capacity =
         nogoods_lengths_str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    for (p_Var21 = (_Rb_tree_node_base *)pcStack_16e0;
        p_Var21 !=
        (_Rb_tree_node_base *)
        &assignments_copy.values.
         super__Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&nogoods_lengths_str," ");
      std::__cxx11::to_string(&by_thread_nodes,p_Var21[1]._M_color);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&solver_1,
                     &by_thread_nodes,":");
      std::__cxx11::to_string(&by_thread_propagations,*(int *)&p_Var21[1].field_0x4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &duplicate_filter_set_mutex,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&solver_1,
                     &by_thread_propagations);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&nogoods_lengths_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &duplicate_filter_set_mutex);
      std::__cxx11::string::~string((string *)&duplicate_filter_set_mutex);
      std::__cxx11::string::~string((string *)&by_thread_propagations);
      std::__cxx11::string::~string((string *)&solver_1);
      std::__cxx11::string::~string((string *)&by_thread_nodes);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &duplicate_filter_set_mutex,"nogoods_lengths =",&nogoods_lengths_str);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &duplicate_filter_set_mutex);
    std::__cxx11::string::~string((string *)&duplicate_filter_set_mutex);
    std::__cxx11::string::~string((string *)&nogoods_lengths_str);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)&assignments_copy);
  }
  innards::HomomorphismModel::add_extra_stats(solver.super_HomomorphismSolver.model,&local_1628);
  innards::HomomorphismSearcher::~HomomorphismSearcher((HomomorphismSearcher *)&permitted);
  std::
  _Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  ::~_Vector_base((_Vector_base<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   *)&assignments);
LAB_0011e326:
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  ~vector(&domains);
  HomomorphismResult::operator=(__return_storage_ptr__,(HomomorphismResult *)&cancel_out);
  HomomorphismResult::~HomomorphismResult((HomomorphismResult *)&cancel_out);
  pTVar5 = (ThreadedSolver *)&solver;
LAB_0011e358:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(pTVar5->super_HomomorphismSolver).proof.
              super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sVar3 = (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((sVar3 == 0 & __return_storage_ptr__->complete) == 1) {
      innards::Proof::finish_unsat_proof
                (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    else if (sVar3 == 0) {
      innards::Proof::finish_unknown_proof
                (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    else {
      innards::Proof::finish_sat_proof
                (proof.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  goto LAB_0011e399;
}

Assistant:

auto gss::solve_homomorphism_problem(
    const InputGraph & pattern,
    const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    // start by setting up proof logging, if necessary
    shared_ptr<Proof> proof;
    if (params.proof_options) {
        // proof logging is currently incompatible with a whole load of "extra" features,
        // but can be adapted to support most of them
        if (1 != params.n_threads)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with threads"};
        if (params.clique_detection)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with clique detection, use --no-clique-detection"};
        if (params.lackey)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with a lackey"};
        if (! params.pattern_less_constraints.empty() || ! params.target_occur_less_constraints.empty())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with less-constraints"};
        if (params.injectivity != Injectivity::Injective && params.injectivity != Injectivity::NonInjective)
            throw UnsupportedConfiguration{"Proof logging can currently only be used with injectivity or non-injectivity"};
        if (pattern.has_vertex_labels() || pattern.has_edge_labels())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used on labelled graphs"};

        proof = make_shared<Proof>(*params.proof_options);

        // set up our model file, with a set of OPB variables for each CP variable
        for (int n = 0; n < pattern.size(); ++n) {
            proof->create_cp_variable(
                n, target.size(),
                [&](int v) { return pattern.vertex_name(v); },
                [&](int v) { return target.vertex_name(v); });
        }

        // generate constraints for injectivity
        if (params.injectivity == Injectivity::Injective)
            proof->create_injectivity_constraints(pattern.size(), target.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < pattern.size(); ++p) {
            for (int t = 0; t < target.size(); ++t) {
                // it's simpler to always have the adjacency constraints, even
                // if the assignment is forbidden
                proof->start_adjacency_constraints_for(p, t);

                // if p can be mapped to t, then each neighbour of p...
                for (int q = 0; q < pattern.size(); ++q)
                    if (pattern.adjacent(p, q)) {
                        // ... must be mapped to a neighbour of t
                        vector<int> permitted, cancel_out;
                        for (int u = 0; u < target.size(); ++u)
                            if (target.adjacent(t, u)) {
                                permitted.push_back(u);
                                if (t == u)
                                    cancel_out.push_back(t);
                            }
                        proof->create_adjacency_constraint(p, q, t, permitted, cancel_out, false);
                    }

                // same for non-adjacency for induced
                if (params.induced) {
                    for (int q = 0; q < pattern.size(); ++q)
                        if (q != p && ! pattern.adjacent(p, q)) {
                            // ... must be mapped to a neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < target.size(); ++u)
                                if (t != u && ! target.adjacent(t, u))
                                    permitted.push_back(u);
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, true);
                        }
                }
            }
        }

        // output the model file
        proof->finalise_model();
    }

    // first sanity check: if we're finding an injective mapping, and there
    // aren't enough vertices, fail immediately.
    if (is_nonshrinking(params) && (pattern.size() > target.size())) {
        if (proof) {
            proof->failure_due_to_pattern_bigger_than_target();
            proof->finish_unsat_proof();
        }

        return HomomorphismResult{};
    }

    // does the target have loops, and are we looking for a single non-injective mapping?
    if ((params.injectivity == Injectivity::NonInjective) && ! pattern.has_vertex_labels() && ! pattern.has_edge_labels() && target.loopy() && ! params.count_solutions && ! params.enumerate_callback) {
        HomomorphismResult result;
        result.extra_stats.emplace_back("used_loops_property = true");
        result.complete = true;
        int loop = -1;
        for (int t = 0; t < target.size(); ++t)
            if (target.adjacent(t, t)) {
                loop = t;
                break;
            }

        for (int n = 0; n < pattern.size(); ++n)
            result.mapping.emplace(n, loop);

        ++result.solution_count;

        return result;
    }

    // is the pattern a clique? if so, use a clique algorithm instead
    if (can_use_clique(params) && is_simple_clique(pattern)) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = make_optional(pattern.size());
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto clique_result = solve_clique_problem(target, clique_params);

        // now translate the result back into what we expect
        HomomorphismResult result;
        int v = 0;
        for (auto & m : clique_result.clique) {
            result.mapping.emplace(v++, m);
            // the clique solver can find a bigger clique than we ask for
            if (v >= pattern.size())
                break;
        }
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        // just solve the problem
        HomomorphismModel model(target, pattern, params, proof);

        if (! model.prepare()) {
            HomomorphismResult result;
            result.extra_stats.emplace_back("model_consistent = false");
            result.complete = true;
            if (proof)
                proof->finish_unsat_proof();
            return result;
        }

        HomomorphismResult result;
        if (1 == params.n_threads) {
            SequentialSolver solver(model, params, proof);
            result = solver.solve();
        }
        else {
            if (! params.restarts_schedule->might_restart())
                throw UnsupportedConfiguration{"Threaded search requires restarts"};

            unsigned n_threads = how_many_threads(params.n_threads);
            ThreadedSolver solver(model, params, proof, n_threads);
            result = solver.solve();
        }

        if (proof) {
            if (result.complete && result.mapping.empty())
                proof->finish_unsat_proof();
            else if (! result.mapping.empty())
                proof->finish_sat_proof();
            else
                proof->finish_unknown_proof();
        }

        return result;
    }
}